

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairCompletePdu.cpp
# Opt level: O3

int __thiscall DIS::RepairCompletePdu::getMarshalledSize(RepairCompletePdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = LogisticsFamilyPdu::getMarshalledSize(&this->super_LogisticsFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_receivingEntityID);
  iVar3 = EntityID::getMarshalledSize(&this->_repairingEntityID);
  return iVar3 + iVar2 + iVar1 + 4;
}

Assistant:

int RepairCompletePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = LogisticsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _receivingEntityID.getMarshalledSize();  // _receivingEntityID
   marshalSize = marshalSize + _repairingEntityID.getMarshalledSize();  // _repairingEntityID
   marshalSize = marshalSize + 2;  // _repair
   marshalSize = marshalSize + 2;  // _padding2
    return marshalSize;
}